

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O3

bool __thiscall ProString::endsWith(ProString *this,char *sub,CaseSensitivity cs)

{
  char16_t *pcVar1;
  long lVar2;
  undefined1 uVar3;
  CutResult CVar4;
  long lVar5;
  long lVar6;
  char16_t *pcVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QLatin1String QVar9;
  char16_t *local_40;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->m_string).d.ptr;
  local_38 = (long)this->m_offset;
  local_40 = (char16_t *)(long)this->m_length;
  CVar4 = QtPrivate::QContainerImplHelper::mid
                    ((this->m_string).d.size,&local_38,(qsizetype *)&local_40);
  if (sub == (char *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar6 = -1;
    do {
      lVar5 = lVar6 + 1;
      lVar2 = lVar6 + 1;
      lVar6 = lVar5;
    } while (sub[lVar2] != '\0');
  }
  pcVar7 = local_40;
  pcVar1 = pcVar1 + local_38;
  if (CVar4 == Null) {
    pcVar7 = (char16_t *)0x0;
    pcVar1 = (char16_t *)0x0;
  }
  QVar8.m_data = pcVar1;
  QVar8.m_size = (qsizetype)pcVar7;
  QVar9.m_data = sub;
  QVar9.m_size = lVar5;
  uVar3 = QtPrivate::endsWith(QVar8,QVar9,cs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool endsWith(const char *sub, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return toQStringView().endsWith(QLatin1String(sub), cs); }